

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * cargo_get_fprintl_args
                 (int argc,char **argv,int start,cargo_fprint_flags_t flags,size_t max_width,
                 size_t highlight_count,cargo_highlight_t *highlights_in)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  void *__base;
  int *piVar4;
  char *size;
  char *ptr;
  size_t sVar5;
  void *__s;
  int iVar6;
  size_t local_c0;
  int has_color;
  char *highlvec;
  cargo_phighlight_t *h_1;
  cargo_phighlight_t *hprev;
  cargo_phighlight_t *h;
  cargo_phighlight_t *highlights;
  size_t out_size;
  char *out;
  cargo_str_t str;
  size_t arglen;
  int local_48;
  int global_indent;
  int j;
  int i;
  char *ret;
  size_t highlight_count_local;
  size_t max_width_local;
  cargo_fprint_flags_t flags_local;
  int start_local;
  char **argv_local;
  char *pcStack_10;
  int argc_local;
  
  _j = (char *)0x0;
  arglen._4_4_ = 0;
  str.diff = 0;
  highlights = (cargo_phighlight_t *)0x0;
  if (highlights_in == (cargo_highlight_t *)0x0) {
    __assert_fail("highlights_in",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x12de,
                  "char *cargo_get_fprintl_args(int, char **, int, cargo_fprint_flags_t, size_t, size_t, const cargo_highlight_t *)"
                 );
  }
  sVar3 = _cargo_process_max_width(max_width);
  __base = _cargo_calloc(highlight_count,0x20);
  if (__base == (void *)0x0) {
    pcStack_10 = (char *)0x0;
  }
  else {
    for (global_indent = 0; iVar6 = (int)highlight_count, global_indent < iVar6;
        global_indent = global_indent + 1) {
      *(int *)((long)__base + (long)global_indent * 0x20) = highlights_in[global_indent].i;
      *(char **)((long)__base + (long)global_indent * 0x20 + 8) = highlights_in[global_indent].c;
    }
    qsort(__base,highlight_count,0x20,_cargo_compare_highlights);
    local_48 = 0;
    for (global_indent = 0; global_indent < argc; global_indent = global_indent + 1) {
      if (global_indent < start) {
        local_c0 = 0;
      }
      else {
        local_c0 = strlen(argv[global_indent]);
      }
      str.diff = local_c0;
      if (sVar3 <= local_c0 + (long)arglen._4_4_) break;
      if ((local_48 < iVar6) &&
         (piVar4 = (int *)((long)__base + (long)local_48 * 0x20), *piVar4 == global_indent)) {
        if (start <= global_indent) {
          piVar4[7] = 1;
        }
        piVar4[6] = (int)local_c0;
        piVar4[5] = arglen._4_4_;
        if (local_48 < 1) {
          piVar4[4] = piVar4[5];
        }
        else {
          piVar4[4] = piVar4[5] -
                      (*(int *)((long)__base + (long)(local_48 + -1) * 0x20 + 0x14) +
                      *(int *)((long)__base + (long)(local_48 + -1) * 0x20 + 0x18));
        }
        sVar5 = strlen(*(char **)(piVar4 + 2));
        highlights = (cargo_phighlight_t *)((long)&highlights->i + sVar5);
        local_48 = local_48 + 1;
      }
      arglen._4_4_ = arglen._4_4_ + (int)str.diff;
      if (start <= global_indent) {
        arglen._4_4_ = arglen._4_4_ + 1;
      }
      highlights = (cargo_phighlight_t *)((long)&highlights->i + (long)arglen._4_4_);
    }
    size = (char *)((long)((long)&highlights->i + 2) * 2);
    ptr = (char *)_cargo_malloc((size_t)size);
    pcVar2 = _j;
    if (ptr != (char *)0x0) {
      str.l = 0;
      out = ptr;
      str.s = size;
      global_indent = start;
      if ((flags & CARGO_FPRINT_NOARGS) == 0) {
        while ((sVar1 = str.l, global_indent < argc &&
               (sVar5 = strlen(argv[global_indent]), sVar1 + sVar5 < sVar3))) {
          cargo_appendf((cargo_str_t *)&out,"%s ",argv[global_indent]);
          global_indent = global_indent + 1;
        }
        cargo_appendf((cargo_str_t *)&out,"\n");
      }
      pcVar2 = ptr;
      if ((flags & CARGO_FPRINT_NOHIGHLIGHT) == 0) {
        for (global_indent = 0; pcVar2 = ptr, global_indent < iVar6;
            global_indent = global_indent + 1) {
          sVar5 = strlen(*(char **)((long)__base + (long)global_indent * 0x20 + 8));
          if (*(int *)((long)__base + (long)global_indent * 0x20 + 0x18) != 0) {
            __s = _cargo_malloc((long)*(int *)((long)__base + (long)global_indent * 0x20 + 0x18));
            pcVar2 = _j;
            if (__s == (void *)0x0) break;
            memset(__s,(uint)**(byte **)((long)__base + (long)global_indent * 0x20 + 8),
                   (long)*(int *)((long)__base + (long)global_indent * 0x20 + 0x18));
            if ((((flags & CARGO_FPRINT_NOCOLOR) == 0) && (1 < sVar5)) &&
               (*(int *)((long)__base + (long)global_indent * 0x20 + 0x1c) != 0)) {
              cargo_appendf((cargo_str_t *)&out,"%s",
                            *(long *)((long)__base + (long)global_indent * 0x20 + 8) + 1);
            }
            cargo_appendf((cargo_str_t *)&out,"%*s%*.*s",
                          (ulong)*(uint *)((long)__base + (long)global_indent * 0x20 + 0x10),"",
                          (ulong)*(uint *)((long)__base + (long)global_indent * 0x20 + 0x18),
                          (ulong)*(uint *)((long)__base + (long)global_indent * 0x20 + 0x18),__s);
            if ((((flags & CARGO_FPRINT_NOCOLOR) == 0) && (1 < sVar5)) &&
               (*(int *)((long)__base + (long)global_indent * 0x20 + 0x1c) != 0)) {
              cargo_appendf((cargo_str_t *)&out,"%s","\x1b[0m");
            }
            _cargo_free(__s);
          }
        }
      }
    }
    _j = pcVar2;
    if (_j == (char *)0x0) {
      _cargo_free(ptr);
    }
    _cargo_free(__base);
    pcStack_10 = _j;
  }
  return pcStack_10;
}

Assistant:

char *cargo_get_fprintl_args(int argc, char **argv, int start,
                            cargo_fprint_flags_t flags,
                            size_t max_width,
                            size_t highlight_count,
                            const cargo_highlight_t *highlights_in)
{
    char *ret = NULL;
    int i;
    int j;
    int global_indent = 0;
    size_t arglen = 0;
    cargo_str_t str;
    char *out = NULL;
    size_t out_size = 0;
    cargo_phighlight_t *highlights = NULL;
    assert(highlights_in);

    max_width = _cargo_process_max_width(max_width);

    if (!(highlights = _cargo_calloc(highlight_count, sizeof(cargo_phighlight_t))))
    {
        CARGODBG(1, "Out of memory!\n");
        return NULL;
    }

    for (i = 0; i < (int)highlight_count; i++)
    {
        highlights[i].i = highlights_in[i].i;
        highlights[i].c = highlights_in[i].c;
        CARGODBG(6, "  Highlight %d: %d\n", i, highlights[i].i);
    }

    CARGODBG(6, "  Sort highlights:\n");
    qsort(highlights, highlight_count,
        sizeof(cargo_phighlight_t), _cargo_compare_highlights);

    #if (CARGO_DEBUG >= 6)
    for (i = 0; i < (int)highlight_count; i++)
    {
        CARGODBG(6, "  Highlight %d: %d\n", i, highlights[i].i);
    }
    #endif

    // Get buffer size and highlight data.
    for (i = 0, j = 0; i < argc; i++)
    {
        arglen = (i >= start) ? strlen(argv[i]) : 0;

        if (arglen + global_indent >= max_width)
        {
            break;
        }

        if (j < (int)highlight_count)
        {
            cargo_phighlight_t *h = &highlights[j];
            if (h->i == i)
            {
                // We only keep this flag so that we can make sure we don't
                // output the color codes when an index is out of range.
                if (i >= start)
                {
                    h->show = 1;
                }

                h->highlight_len = (int)arglen;
                h->total_indent = global_indent;

                // We want to indent in relation to the previous indentation.
                if (j > 0)
                {
                    cargo_phighlight_t *hprev = &highlights[j - 1];
                    h->indent = h->total_indent
                              - (hprev->total_indent + hprev->highlight_len);
                }
                else
                {
                    h->indent = h->total_indent;
                }

                // If we use color, we must include the ANSI color code length
                // in the buffer length as well.
                out_size += strlen(h->c);

                j++;
            }
        }

        global_indent += arglen;
        if (i >= start) global_indent++; // + 1 for space.
        out_size += global_indent;
    }

    // Allocate and fill buffer.
    out_size += 2; // New lines.
    out_size *= 2; // Two rows, one for args and one for highlighting.

    if (!(out = _cargo_malloc(out_size)))
    {
        CARGODBG(1, "Out of memory!\n");
        goto fail;
    }

    str.s = out;
    str.l = out_size;
    str.offset = 0;

    // TODO: Try adding an "..." and try to fit all highlights on screen if possible.
    if (!(flags & CARGO_FPRINT_NOARGS))
    {
        for (i = start; i < argc; i++)
        {
            // The highlight will be incorrect if we allow a line break.
            if (str.offset + strlen(argv[i]) >= max_width)
            {
                break;
            }

            cargo_appendf(&str, "%s ", argv[i]);
        }

        cargo_appendf(&str, "\n");
    }

    if (!(flags & CARGO_FPRINT_NOHIGHLIGHT))
    {
        for (i = 0; i < (int)highlight_count; i++)
        {
            cargo_phighlight_t *h = &highlights[i];
            char *highlvec;
            int has_color = strlen(h->c) > 1;

            if (h->highlight_len == 0)
                continue;

            if (!(highlvec = _cargo_malloc(h->highlight_len)))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }

            // Use the first character as the highlight character.
            //                                ~~~~~~~~~
            memset(highlvec, *h->c, h->highlight_len);

            // If we have more characters, we append that as a string.
            // (This can be used for color ansi color codes).
            if (!(flags & CARGO_FPRINT_NOCOLOR) && has_color && h->show)
            {
                cargo_appendf(&str, "%s", &h->c[1]);
            }

            cargo_appendf(&str, "%*s%*.*s",
                h->indent, "",
                h->highlight_len,
                h->highlight_len,
                highlvec);

            if (!(flags & CARGO_FPRINT_NOCOLOR) && has_color && h->show)
            {
                cargo_appendf(&str, "%s", CARGO_COLOR_RESET);
            }

            _cargo_free(highlvec);
        }
    }

    ret = out;

fail:
    if (!ret) _cargo_free(out);
    _cargo_free(highlights);

    return ret;
}